

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void item_discovered(tgestate_t *state,item_t item)

{
  uint8_t uVar1;
  byte bVar2;
  itemstruct_t *itemstr;
  byte in_SIL;
  tgestate_t *in_RDI;
  itemstruct_t *itemstruct;
  room_t room;
  default_item_location_t *default_item_location;
  
  if (in_SIL != 0xff) {
    bVar2 = in_SIL & 0xf;
    queue_message(in_RDI,message_ITEM_DISCOVERED);
    decrease_morale(in_RDI,'\x05');
    uVar1 = default_item_locations[bVar2].room_and_flags;
    itemstr = in_RDI->item_structs + bVar2;
    itemstr->item_and_flags = itemstr->item_and_flags & 0x7f;
    itemstr->room_and_flags = default_item_locations[bVar2].room_and_flags;
    (itemstr->mappos).u = default_item_locations[bVar2].mappos.u;
    (itemstr->mappos).v = default_item_locations[bVar2].mappos.v;
    if (uVar1 == '\0') {
      (itemstr->mappos).w = '\0';
      calc_exterior_item_isopos(itemstr);
    }
    else {
      (itemstr->mappos).w = '\x05';
      calc_interior_item_isopos(itemstr);
    }
  }
  return;
}

Assistant:

void item_discovered(tgestate_t *state, item_t item)
{
  const default_item_location_t *default_item_location; /* was HL/DE */
  room_t                         room;                  /* was A */
  itemstruct_t                  *itemstruct;            /* was HL/DE */

  assert(state != NULL);

  if (item == item_NONE)
    return;

  /* BUG FIX: 'item' was not masked in the original code. */
  item &= itemstruct_ITEM_MASK;

  ASSERT_ITEM_VALID(item);

  queue_message(state, message_ITEM_DISCOVERED);
  decrease_morale(state, 5);

  default_item_location = &default_item_locations[item];
  room = default_item_location->room_and_flags;

  itemstruct = &state->item_structs[item];
  itemstruct->item_and_flags &= ~itemstruct_ITEM_FLAG_HELD;
  itemstruct->room_and_flags = default_item_location->room_and_flags;
  itemstruct->mappos.u = default_item_location->mappos.u;
  itemstruct->mappos.v = default_item_location->mappos.v;

  if (room == room_0_OUTDOORS)
  {
    /* Conv: The original code assigned 'room' here since it's already zero. */
    itemstruct->mappos.w = 0;
    calc_exterior_item_isopos(itemstruct);
  }
  else
  {
    itemstruct->mappos.w = 5;
    calc_interior_item_isopos(itemstruct);
  }
}